

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O0

void __thiscall Assimp::ColladaExporter::WriteFile(ColladaExporter *this)

{
  ostream *poVar1;
  char *pcVar2;
  string *psVar3;
  undefined1 *puVar4;
  allocator local_91;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  ColladaExporter *local_10;
  ColladaExporter *this_local;
  
  puVar4 = &this->field_0x38;
  local_10 = this;
  poVar1 = std::operator<<((ostream *)puVar4,
                           "<?xml version=\"1.0\" encoding=\"UTF-8\" standalone=\"no\" ?>");
  psVar3 = &this->endstr;
  std::operator<<(poVar1,(string *)psVar3);
  poVar1 = std::operator<<((ostream *)puVar4,
                           "<COLLADA xmlns=\"http://www.collada.org/2005/11/COLLADASchema\" version=\"1.4.1\">"
                          );
  std::operator<<(poVar1,(string *)psVar3);
  PushTag(this);
  WriteTextures(this);
  WriteHeader(this);
  WriteCamerasLibrary(this);
  WriteLightsLibrary(this);
  WriteMaterials(this);
  WriteGeometryLibrary(this);
  WriteControllerLibrary(this);
  WriteSceneLibrary(this);
  WriteAnimationsLibrary(this);
  poVar1 = std::operator<<((ostream *)puVar4,(string *)&this->startstr);
  poVar1 = std::operator<<(poVar1,"<scene>");
  std::operator<<(poVar1,(string *)psVar3);
  PushTag(this);
  poVar1 = std::operator<<((ostream *)puVar4,(string *)&this->startstr);
  pcVar2 = aiString::C_Str(&this->mScene->mRootNode->mName);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,pcVar2,&local_91);
  XMLEscape(&local_70,&local_90);
  std::operator+(&local_50,"<instance_visual_scene url=\"#",&local_70);
  std::operator+(&local_30,&local_50,"\" />");
  poVar1 = std::operator<<(poVar1,(string *)&local_30);
  std::operator<<(poVar1,(string *)&this->endstr);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  PopTag(this);
  poVar1 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  poVar1 = std::operator<<(poVar1,"</scene>");
  std::operator<<(poVar1,(string *)&this->endstr);
  PopTag(this);
  poVar1 = std::operator<<((ostream *)&this->field_0x38,"</COLLADA>");
  std::operator<<(poVar1,(string *)&this->endstr);
  return;
}

Assistant:

void ColladaExporter::WriteFile() {
    // write the DTD
    mOutput << "<?xml version=\"1.0\" encoding=\"UTF-8\" standalone=\"no\" ?>" << endstr;
    // COLLADA element start
    mOutput << "<COLLADA xmlns=\"http://www.collada.org/2005/11/COLLADASchema\" version=\"1.4.1\">" << endstr;
    PushTag();

    WriteTextures();
    WriteHeader();

    WriteCamerasLibrary();
    WriteLightsLibrary();
    WriteMaterials();
    WriteGeometryLibrary();
    WriteControllerLibrary();

    WriteSceneLibrary();
	
	// customized, Writes the animation library
	WriteAnimationsLibrary();

    // useless Collada fu at the end, just in case we haven't had enough indirections, yet.
    mOutput << startstr << "<scene>" << endstr;
    PushTag();
    mOutput << startstr << "<instance_visual_scene url=\"#" + XMLEscape(mScene->mRootNode->mName.C_Str()) + "\" />" << endstr;
    PopTag();
    mOutput << startstr << "</scene>" << endstr;
    PopTag();
    mOutput << "</COLLADA>" << endstr;
}